

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::resolve_tag(Tree *this,substr output,csubstr tag,size_t node_id)

{
  char *__dest;
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  size_t sVar15;
  size_t sVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  char cVar23;
  size_t sVar24;
  bool bVar25;
  ro_substr chars;
  ro_substr chars_00;
  csubstr rest;
  char msg [28];
  basic_substring<const_char> local_220;
  Tree *local_210;
  basic_substring<const_char> local_208;
  undefined1 uStack_1f8;
  undefined2 uStack_1f7;
  undefined1 uStack_1f5;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined1 uStack_1f0;
  undefined2 uStack_1ef;
  undefined1 uStack_1ed;
  undefined4 uStack_1ec;
  undefined1 local_1e8;
  ulong local_1e0;
  char *local_1d8;
  size_t local_1d0;
  ulong local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_1d8 = output.str;
  lVar21 = 3;
  do {
    pcVar2 = this->m_tag_directives[lVar21].handle.str;
    uVar20 = this->m_tag_directives[lVar21].handle.len;
    if (uVar20 <= tag.len && (pcVar2 != (char *)0x0 && uVar20 != 0)) {
      uVar22 = 0;
      do {
        if (tag.str[uVar22] != pcVar2[uVar22]) goto LAB_0020e58d;
        uVar22 = uVar22 + 1;
      } while (uVar20 != uVar22);
      if (this->m_tag_directives[lVar21].next_node_id <= node_id) {
        local_210 = this;
        basic_substring<const_char>::basic_substring(&local_208,tag.str + uVar20,tag.len - uVar20);
        local_220.len =
             CONCAT26(local_208.len._6_2_,
                      CONCAT24(local_208.len._4_2_,
                               CONCAT13(local_208.len._3_1_,
                                        CONCAT21(local_208.len._1_2_,(undefined1)local_208.len))));
        local_220.str = local_208.str;
        sVar24 = local_220.len + this->m_tag_directives[lVar21].prefix.len + 2;
        sVar15 = basic_substring<const_char>::first_of(&local_220,'%',0);
        if (sVar15 == 0xffffffffffffffff) goto LAB_0020eebe;
        lVar18 = 0;
        do {
          sVar15 = basic_substring<const_char>::first_of(&local_220,'%',sVar15 + 1);
          lVar18 = lVar18 + -1;
        } while (sVar15 != 0xffffffffffffffff);
        if (lVar18 == 0) {
LAB_0020eebe:
          pcVar2 = local_1d8;
          if (sVar24 <= output.len) {
            *local_1d8 = '<';
            __dest = local_1d8 + 1;
            memcpy(__dest,this->m_tag_directives[lVar21].prefix.str,
                   this->m_tag_directives[lVar21].prefix.len);
            memcpy(__dest + this->m_tag_directives[lVar21].prefix.len,local_220.str,local_220.len);
            pcVar2[local_220.len + 1 + this->m_tag_directives[lVar21].prefix.len] = '>';
          }
        }
        else {
          local_1e0 = output.len;
          sVar15 = basic_substring<const_char>::first_of(&local_220,'%',0);
          if (sVar15 == 0xffffffffffffffff) {
            uStack_1f8 = 0x6f;
            uStack_1f7 = 0x2073;
            uStack_1f5 = 0x21;
            uStack_1f4 = 0x203d;
            uStack_1f2 = 0x706e;
            uStack_1f0 = 0x6f;
            uStack_1ef = 0x2973;
            uStack_1ed = 0;
            local_208.str = (char *)0x6166206b63656863;
            local_208.len._0_1_ = 0x69;
            local_208.len._1_2_ = 0x656c;
            local_208.len._3_1_ = 100;
            local_208.len._4_2_ = 0x203a;
            local_208.len._6_2_ = 0x7028;
            if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
              pcVar4 = (code *)swi(3);
              sVar24 = (*pcVar4)();
              return sVar24;
            }
            local_58 = 0;
            uStack_50 = 0x683e;
            local_48 = 0;
            pcStack_40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_38 = 0x65;
            LVar5.super_LineCol.col = 0;
            LVar5.super_LineCol.offset = SUB168(ZEXT816(0x683e) << 0x40,0);
            LVar5.super_LineCol.line = SUB168(ZEXT816(0x683e) << 0x40,8);
            LVar5.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar5.name.len = 0x65;
            (*(local_210->m_callbacks).m_error)
                      ((char *)&local_208,0x1c,LVar5,(local_210->m_callbacks).m_user_data);
          }
          do {
            uVar20 = sVar15 + 1;
            chars.len = 0x16;
            chars.str = "0123456789abcdefABCDEF";
            sVar16 = basic_substring<const_char>::first_not_of(&local_220,chars,uVar20);
            if (sVar16 == 0xffffffffffffffff) {
              sVar16 = local_220.len;
            }
            if (sVar16 <= uVar20) {
              uStack_1f8 = 0x73;
              uStack_1f7 = 0x312b;
              uStack_1f5 = 0x20;
              uStack_1f4 = 0x203c;
              uStack_1f2 = 0x656e;
              uStack_1f0 = 0x78;
              uStack_1ef = 0x74;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x6f70;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_80 = 0;
              uStack_78 = 0x6843;
              local_70 = 0;
              pcStack_68 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_60 = 0x65;
              LVar6.super_LineCol.col = 0;
              LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6843) << 0x40,0);
              LVar6.super_LineCol.line = SUB168(ZEXT816(0x6843) << 0x40,8);
              LVar6.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar6.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x1b,LVar6,(local_210->m_callbacks).m_user_data);
            }
            if (sVar16 < sVar15 + 3) {
              uStack_1f8 = 0x73;
              uStack_1f7 = 0x312b;
              uStack_1f5 = 0x20;
              uStack_1f4 = 0x202b;
              uStack_1f2 = 0x2032;
              uStack_1f0 = 0x3c;
              uStack_1ef = 0x203d;
              uStack_1ed = 0x6e;
              uStack_1ec = 0x747865;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x6f70;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_a8 = 0;
              uStack_a0 = 0x6844;
              local_98 = 0;
              pcStack_90 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_88 = 0x65;
              LVar7.super_LineCol.col = 0;
              LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6844) << 0x40,0);
              LVar7.super_LineCol.line = SUB168(ZEXT816(0x6844) << 0x40,8);
              LVar7.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar7.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x20,LVar7,(local_210->m_callbacks).m_user_data);
            }
            sVar24 = sVar24 + (uVar20 - sVar16);
            sVar15 = basic_substring<const_char>::first_of(&local_220,'%',uVar20);
          } while (sVar15 != 0xffffffffffffffff);
          if (sVar24 <= local_1e0) {
            *local_1d8 = '<';
            sVar3 = this->m_tag_directives[lVar21].prefix.len;
            local_1d0 = sVar24;
            memcpy(local_1d8 + 1,this->m_tag_directives[lVar21].prefix.str,sVar3);
            sVar15 = basic_substring<const_char>::first_of(&local_220,'%',0);
            if (sVar15 == 0xffffffffffffffff) {
              uStack_1f8 = 0x6f;
              uStack_1f7 = 0x2073;
              uStack_1f5 = 0x21;
              uStack_1f4 = 0x203d;
              uStack_1f2 = 0x706e;
              uStack_1f0 = 0x6f;
              uStack_1ef = 0x2973;
              uStack_1ed = 0;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x7028;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_d0 = 0;
              uStack_c8 = 0x6851;
              local_c0 = 0;
              pcStack_b8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_b0 = 0x65;
              LVar8.super_LineCol.col = 0;
              LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6851) << 0x40,0);
              LVar8.super_LineCol.line = SUB168(ZEXT816(0x6851) << 0x40,8);
              LVar8.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar8.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x1c,LVar8,(local_210->m_callbacks).m_user_data);
            }
            local_1e0 = sVar3 + 1;
            uVar20 = 0;
            do {
              uVar22 = sVar15 + 1;
              chars_00.len = 0x16;
              chars_00.str = "0123456789abcdefABCDEF";
              sVar24 = basic_substring<const_char>::first_not_of(&local_220,chars_00,uVar22);
              if (sVar24 == 0xffffffffffffffff) {
                sVar24 = local_220.len;
              }
              if (sVar24 <= uVar22) {
                uStack_1f8 = 0x73;
                uStack_1f7 = 0x312b;
                uStack_1f5 = 0x20;
                uStack_1f4 = 0x203c;
                uStack_1f2 = 0x656e;
                uStack_1f0 = 0x78;
                uStack_1ef = 0x74;
                local_208.str = (char *)0x6166206b63656863;
                local_208.len._0_1_ = 0x69;
                local_208.len._1_2_ = 0x656c;
                local_208.len._3_1_ = 100;
                local_208.len._4_2_ = 0x203a;
                local_208.len._6_2_ = 0x6f70;
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                local_f8 = 0;
                uStack_f0 = 0x6856;
                local_e8 = 0;
                pcStack_e0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_d8 = 0x65;
                LVar9.super_LineCol.col = 0;
                LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6856) << 0x40,0);
                LVar9.super_LineCol.line = SUB168(ZEXT816(0x6856) << 0x40,8);
                LVar9.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar9.name.len = 0x65;
                (*(local_210->m_callbacks).m_error)
                          ((char *)&local_208,0x1b,LVar9,(local_210->m_callbacks).m_user_data);
              }
              if (sVar24 < sVar15 + 3) {
                uStack_1f8 = 0x73;
                uStack_1f7 = 0x312b;
                uStack_1f5 = 0x20;
                uStack_1f4 = 0x202b;
                uStack_1f2 = 0x2032;
                uStack_1f0 = 0x3c;
                uStack_1ef = 0x203d;
                uStack_1ed = 0x6e;
                uStack_1ec = 0x747865;
                local_208.str = (char *)0x6166206b63656863;
                local_208.len._0_1_ = 0x69;
                local_208.len._1_2_ = 0x656c;
                local_208.len._3_1_ = 100;
                local_208.len._4_2_ = 0x203a;
                local_208.len._6_2_ = 0x6f70;
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                local_120 = 0;
                uStack_118 = 0x6857;
                local_110 = 0;
                pcStack_108 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_100 = 0x65;
                LVar10.super_LineCol.col = 0;
                LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6857) << 0x40,0);
                LVar10.super_LineCol.line = SUB168(ZEXT816(0x6857) << 0x40,8);
                LVar10.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar10.name.len = 0x65;
                (*(local_210->m_callbacks).m_error)
                          ((char *)&local_208,0x20,LVar10,(local_210->m_callbacks).m_user_data);
              }
              if (local_220.len < uVar22) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1544,"first >= 0 && first <= len");
              }
              uVar19 = sVar24;
              if (sVar24 == 0xffffffffffffffff) {
                uVar19 = local_220.len;
              }
              if (uVar19 < uVar22) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1546,"first <= last");
              }
              if (local_220.len < uVar19) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1547,"last >= 0 && last <= len");
              }
              basic_substring<const_char>::basic_substring
                        (&local_208,local_220.str + uVar22,uVar19 - uVar22);
              lVar21 = CONCAT26(local_208.len._6_2_,
                                CONCAT24(local_208.len._4_2_,
                                         CONCAT13(local_208.len._3_1_,
                                                  CONCAT21(local_208.len._1_2_,
                                                           (undefined1)local_208.len))));
              local_1c8 = sVar24;
              if ((lVar21 == 0) || (local_208.str == (char *)0x0)) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x2cac,"!s.empty()");
              }
              lVar18 = 0;
              cVar23 = '\0';
              do {
                cVar1 = local_208.str[lVar18];
                bVar17 = cVar1 - 0x30;
                if (9 < bVar17) {
                  if ((byte)(cVar1 + 0x9fU) < 6) {
                    bVar17 = cVar1 + 0xa9;
                  }
                  else {
                    if (5 < (byte)(cVar1 + 0xbfU)) goto LAB_0020ebc4;
                    bVar17 = cVar1 - 0x37;
                  }
                }
                cVar23 = cVar23 * '\x10' + bVar17;
                lVar18 = lVar18 + 1;
              } while (lVar21 != lVar18);
              if (cVar23 < '\0') {
LAB_0020ebc4:
                local_208.str = (char *)0x2064696c61766e69;
                local_208.len._0_1_ = 0x55;
                local_208.len._1_2_ = 0x4952;
                local_208.len._3_1_ = 0x20;
                local_208.len._4_2_ = 0x6863;
                local_208.len._6_2_ = 0x7261;
                uStack_1f8 = 0x61;
                uStack_1f7 = 0x7463;
                uStack_1f5 = 0x65;
                uStack_1f4 = 0x72;
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                local_148 = 0;
                uStack_140 = 0x685a;
                local_138 = 0;
                pcStack_130 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_128 = 0x65;
                LVar11.super_LineCol.col = 0;
                LVar11.super_LineCol.offset = SUB168(ZEXT816(0x685a) << 0x40,0);
                LVar11.super_LineCol.line = SUB168(ZEXT816(0x685a) << 0x40,8);
                LVar11.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar11.name.len = 0x65;
                (*(local_210->m_callbacks).m_error)
                          ((char *)&local_208,0x16,LVar11,(local_210->m_callbacks).m_user_data);
              }
              if (local_220.len < uVar20) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1544,"first >= 0 && first <= len");
              }
              if (sVar15 == 0xffffffffffffffff) {
                sVar15 = local_220.len;
              }
              if (sVar15 < uVar20) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1546,"first <= last");
              }
              if (local_220.len < sVar15) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                  pcVar4 = (code *)swi(3);
                  sVar24 = (*pcVar4)();
                  return sVar24;
                }
                handle_error(0x2467aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1547,"last >= 0 && last <= len");
              }
              basic_substring<const_char>::basic_substring
                        (&local_208,local_220.str + uVar20,sVar15 - uVar20);
              pcVar2 = local_1d8;
              uVar20 = local_1e0;
              sVar3 = CONCAT26(local_208.len._6_2_,
                               CONCAT24(local_208.len._4_2_,
                                        CONCAT13(local_208.len._3_1_,
                                                 CONCAT21(local_208.len._1_2_,
                                                          (undefined1)local_208.len))));
              memcpy(local_1d8 + local_1e0,local_208.str,sVar3);
              local_1e0 = uVar20 + sVar3 + 1;
              pcVar2[sVar3 + uVar20] = cVar23;
              sVar15 = basic_substring<const_char>::first_of(&local_220,'%',uVar22);
              uVar20 = local_1c8;
              sVar24 = local_1d0;
            } while (sVar15 != 0xffffffffffffffff);
            if (local_1c8 == 0) {
              uStack_1f8 = 0x72;
              uStack_1f7 = 0x7665;
              uStack_1f5 = 0x20;
              uStack_1f4 = 0x203e;
              uStack_1f2 = 0x2930;
              uStack_1f0 = 0;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x7028;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_170 = 0;
              uStack_168 = 0x6861;
              local_160 = 0;
              pcStack_158 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_150 = 0x65;
              LVar12.super_LineCol.col = 0;
              LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6861) << 0x40,0);
              LVar12.super_LineCol.line = SUB168(ZEXT816(0x6861) << 0x40,8);
              LVar12.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar12.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x19,LVar12,(local_210->m_callbacks).m_user_data);
            }
            if (local_220.len < uVar20) {
              uStack_1f8 = 0x65;
              uStack_1f7 = 0x7473;
              uStack_1f5 = 0x2e;
              uStack_1f4 = 0x656c;
              uStack_1f2 = 0x206e;
              uStack_1f0 = 0x3e;
              uStack_1ef = 0x203d;
              uStack_1ed = 0x70;
              uStack_1ec = 0x29766572;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x7228;
              local_1e8 = 0;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_198 = 0;
              uStack_190 = 0x6862;
              local_188 = 0;
              pcStack_180 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_178 = 0x65;
              LVar13.super_LineCol.col = 0;
              LVar13.super_LineCol.offset = SUB168(ZEXT816(0x6862) << 0x40,0);
              LVar13.super_LineCol.line = SUB168(ZEXT816(0x6862) << 0x40,8);
              LVar13.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar13.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x21,LVar13,(local_210->m_callbacks).m_user_data);
            }
            if (local_220.len < uVar20) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              handle_error(0x2467aa,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_208,local_220.str + uVar20,local_220.len - uVar20);
            pcVar2 = local_1d8;
            uVar20 = local_1e0;
            sVar3 = CONCAT26(local_208.len._6_2_,
                             CONCAT24(local_208.len._4_2_,
                                      CONCAT13(local_208.len._3_1_,
                                               CONCAT21(local_208.len._1_2_,
                                                        (undefined1)local_208.len))));
            memcpy(local_1d8 + local_1e0,local_208.str,sVar3);
            pcVar2[sVar3 + uVar20] = '>';
            if (sVar3 + uVar20 + 1 != sVar24) {
              uStack_1f8 = 0x70;
              uStack_1f7 = 0x736f;
              uStack_1f5 = 0x20;
              uStack_1f4 = 0x3d3d;
              uStack_1f2 = 0x6c20;
              uStack_1f0 = 0x65;
              uStack_1ef = 0x296e;
              uStack_1ed = 0;
              local_208.str = (char *)0x6166206b63656863;
              local_208.len._0_1_ = 0x69;
              local_208.len._1_2_ = 0x656c;
              local_208.len._3_1_ = 100;
              local_208.len._4_2_ = 0x203a;
              local_208.len._6_2_ = 0x7728;
              if ((((byte)s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
                pcVar4 = (code *)swi(3);
                sVar24 = (*pcVar4)();
                return sVar24;
              }
              local_1c0 = 0;
              uStack_1b8 = 0x6865;
              local_1b0 = 0;
              pcStack_1a8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_1a0 = 0x65;
              LVar14.super_LineCol.col = 0;
              LVar14.super_LineCol.offset = SUB168(ZEXT816(0x6865) << 0x40,0);
              LVar14.super_LineCol.line = SUB168(ZEXT816(0x6865) << 0x40,8);
              LVar14.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar14.name.len = 0x65;
              (*(local_210->m_callbacks).m_error)
                        ((char *)&local_208,0x1c,LVar14,(local_210->m_callbacks).m_user_data);
            }
          }
        }
        return sVar24;
      }
    }
LAB_0020e58d:
    bVar25 = lVar21 == 0;
    lVar21 = lVar21 + -1;
    if (bVar25) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t Tree::resolve_tag(substr output, csubstr tag, size_t node_id) const
{
    // lookup from the end. We want to find the first directive that
    // matches the tag and has a target node id leq than the given
    // node_id.
    for(size_t i = RYML_MAX_TAG_DIRECTIVES-1; i != (size_t)-1; --i)
    {
        auto const& td = m_tag_directives[i];
        if(td.handle.empty())
            continue;
        if(tag.begins_with(td.handle) && td.next_node_id <= node_id)
        {
            _RYML_CB_ASSERT(m_callbacks, tag.len >= td.handle.len);
            csubstr rest = tag.sub(td.handle.len);
            size_t len = 1u + td.prefix.len + rest.len + 1u;
            size_t numpc = rest.count('%');
            if(numpc == 0)
            {
                if(len <= output.len)
                {
                    output.str[0] = '<';
                    memcpy(1u + output.str, td.prefix.str, td.prefix.len);
                    memcpy(1u + output.str + td.prefix.len, rest.str, rest.len);
                    output.str[1u + td.prefix.len + rest.len] = '>';
                }
            }
            else
            {
                // need to decode URI % sequences
                size_t pos = rest.find('%');
                _RYML_CB_ASSERT(m_callbacks, pos != npos);
                do {
                    size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                    if(next == npos)
                        next = rest.len;
                    _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                    _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                    size_t delta = next - (pos+1);
                    len -= delta;
                    pos = rest.find('%', pos+1);
                } while(pos != npos);
                if(len <= output.len)
                {
                    size_t prev = 0, wpos = 0;
                    auto appendstr = [&](csubstr s) { memcpy(output.str + wpos, s.str, s.len); wpos += s.len; };
                    auto appendchar = [&](char c) { output.str[wpos++] = c; };
                    appendchar('<');
                    appendstr(td.prefix);
                    pos = rest.find('%');
                    _RYML_CB_ASSERT(m_callbacks, pos != npos);
                    do {
                        size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                        if(next == npos)
                            next = rest.len;
                        _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                        _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                        uint8_t val;
                        if(C4_UNLIKELY(!read_hex(rest.range(pos+1, next), &val) || val > 127))
                            _RYML_CB_ERR(m_callbacks, "invalid URI character");
                        appendstr(rest.range(prev, pos));
                        appendchar((char)val);
                        prev = next;
                        pos = rest.find('%', pos+1);
                    } while(pos != npos);
                    _RYML_CB_ASSERT(m_callbacks, pos == npos);
                    _RYML_CB_ASSERT(m_callbacks, prev > 0);
                    _RYML_CB_ASSERT(m_callbacks, rest.len >= prev);
                    appendstr(rest.sub(prev));
                    appendchar('>');
                    _RYML_CB_ASSERT(m_callbacks, wpos == len);
                }
            }
            return len;
        }
    }
    return 0; // return 0 to signal that the tag is local and cannot be resolved
}